

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void first_valueStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  char *pcVar1;
  sqlite3_value *psVar2;
  
  if ((short)pCtx->pMem->flags < 0) {
    pcVar1 = pCtx->pMem->z;
  }
  else {
    pcVar1 = (char *)createAggContext(pCtx,0x10);
  }
  if ((pcVar1 != (char *)0x0) && (*(long *)(pcVar1 + 8) == 0)) {
    psVar2 = sqlite3_value_dup(*apArg);
    *(sqlite3_value **)(pcVar1 + 8) = psVar2;
    if (psVar2 == (sqlite3_value *)0x0) {
      sqlite3_result_error_nomem(pCtx);
      return;
    }
  }
  return;
}

Assistant:

static void first_valueStepFunc(
  sqlite3_context *pCtx,
  int nArg,
  sqlite3_value **apArg
){
  struct NthValueCtx *p;
  p = (struct NthValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p && p->pValue==0 ){
    p->pValue = sqlite3_value_dup(apArg[0]);
    if( !p->pValue ){
      sqlite3_result_error_nomem(pCtx);
    }
  }
  UNUSED_PARAMETER(nArg);
  UNUSED_PARAMETER(apArg);
}